

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.cpp
# Opt level: O3

void Diligent::ValidateBottomLevelASDesc(BottomLevelASDesc *Desc)

{
  VALUE_TYPE Val;
  char *pcVar1;
  BLASTriangleDesc *pBVar2;
  BLASBoundingBoxDesc *pBVar3;
  Uint32 UVar4;
  uint uVar5;
  ulong uVar6;
  uint local_54;
  char *local_50;
  Char *local_48;
  Uint32 *local_40;
  Uint32 *local_38;
  
  if (Desc->CompactedSize == 0) {
    local_38 = &Desc->BoxCount;
    UVar4 = Desc->BoxCount;
    local_40 = &Desc->TriangleCount;
    if ((Desc->TriangleCount != 0) == (UVar4 != 0)) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_50 = "";
      if (pcVar1 != (char *)0x0) {
        local_50 = pcVar1;
      }
      LogError<true,char[35],char_const*,char[15],char[26],unsigned_int,char[22],unsigned_int,char[20]>
                (false,"ValidateBottomLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0x30,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                 (char (*) [15])"\' is invalid: ",(char (*) [26])"Exactly one of BoxCount (",
                 local_38,(char (*) [22])") and TriangleCount (",local_40,
                 (char (*) [20])") must be non-zero.");
      UVar4 = Desc->BoxCount;
    }
    if ((Desc->pBoxes == (BLASBoundingBoxDesc *)0x0) && (UVar4 != 0)) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_50 = "";
      if (pcVar1 != (char *)0x0) {
        local_50 = pcVar1;
      }
      LogError<true,char[35],char_const*,char[15],char[13],unsigned_int,char[22]>
                (false,"ValidateBottomLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0x33,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                 (char (*) [15])"\' is invalid: ",(char (*) [13])"BoxCount is ",local_38,
                 (char (*) [22])", but pBoxes is null.");
    }
    if ((Desc->pTriangles == (BLASTriangleDesc *)0x0) && (Desc->TriangleCount != 0)) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_50 = "";
      if (pcVar1 != (char *)0x0) {
        local_50 = pcVar1;
      }
      LogError<true,char[35],char_const*,char[15],char[18],unsigned_int,char[26]>
                (false,"ValidateBottomLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0x36,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                 (char (*) [15])"\' is invalid: ",(char (*) [18])"TriangleCount is ",local_40,
                 (char (*) [26])", but pTriangles is null.");
    }
    if ((~Desc->Flags & 0xc) == 0) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_50 = "";
      if (pcVar1 != (char *)0x0) {
        local_50 = pcVar1;
      }
      LogError<true,char[35],char_const*,char[15],char[110]>
                (false,"ValidateBottomLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0x39,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [110])
                 "RAYTRACING_BUILD_AS_PREFER_FAST_TRACE and RAYTRACING_BUILD_AS_PREFER_FAST_BUILD flags are mutually exclusive."
                );
    }
    local_54 = 0;
    if (*local_40 != 0) {
      do {
        pBVar2 = Desc->pTriangles;
        uVar6 = (ulong)local_54;
        if (pBVar2[uVar6].GeometryName == (Char *)0x0) {
          local_50 = (Desc->super_DeviceObjectAttribs).Name;
          if (local_50 == (char *)0x0) {
            local_50 = "";
          }
          LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[33]>
                    (false,"ValidateBottomLevelASDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0x40,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                     (char (*) [15])"\' is invalid: ",(char (*) [12])0x6a239a,&local_54,
                     (char (*) [33])"].GeometryName must not be null.");
        }
        Val = pBVar2[uVar6].VertexValueType;
        if ((8 < Val) || ((0x184U >> (Val & 0x1f) & 1) == 0)) {
          local_50 = (Desc->super_DeviceObjectAttribs).Name;
          if (local_50 == (char *)0x0) {
            local_50 = "";
          }
          local_48 = GetValueTypeString(Val);
          LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[20],char_const*,char[87]>
                    (false,"ValidateBottomLevelASDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0x44,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                     (char (*) [15])"\' is invalid: ",(char (*) [12])0x6a239a,&local_54,
                     (char (*) [20])"].VertexValueType (",&local_48,
                     (char (*) [87])
                     ") is invalid. Only the following values are allowed: VT_FLOAT32, VT_FLOAT16, VT_INT16."
                    );
        }
        if ((pBVar2[uVar6].VertexComponentCount & 0xfe) != 2) {
          local_50 = (Desc->super_DeviceObjectAttribs).Name;
          if (local_50 == (char *)0x0) {
            local_50 = "";
          }
          local_48 = (Char *)CONCAT44(local_48._4_4_,(uint)pBVar2[uVar6].VertexComponentCount);
          LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[25],unsigned_int,char[39]>
                    (false,"ValidateBottomLevelASDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0x47,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                     (char (*) [15])"\' is invalid: ",(char (*) [12])0x6a239a,&local_54,
                     (char (*) [25])"].VertexComponentCount (",(uint *)&local_48,
                     (char (*) [39])") is invalid. Only 2 or 3 are allowed.");
        }
        if (pBVar2[uVar6].MaxVertexCount == 0) {
          local_50 = (Desc->super_DeviceObjectAttribs).Name;
          if (local_50 == (char *)0x0) {
            local_50 = "";
          }
          LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[41]>
                    (false,"ValidateBottomLevelASDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0x4a,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                     (char (*) [15])"\' is invalid: ",(char (*) [12])0x6a239a,&local_54,
                     (char (*) [41])"].MaxVertexCount must be greater than 0.");
        }
        if (pBVar2[uVar6].MaxPrimitiveCount == 0) {
          local_50 = (Desc->super_DeviceObjectAttribs).Name;
          if (local_50 == (char *)0x0) {
            local_50 = "";
          }
          LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[44]>
                    (false,"ValidateBottomLevelASDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0x4d,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                     (char (*) [15])"\' is invalid: ",(char (*) [12])0x6a239a,&local_54,
                     (char (*) [44])"].MaxPrimitiveCount must be greater than 0.");
        }
        if (1 < pBVar2[uVar6].IndexType - 5) {
          if (pBVar2[uVar6].IndexType == VT_UNDEFINED) {
            UVar4 = pBVar2[uVar6].MaxPrimitiveCount * 3;
            if (pBVar2[uVar6].MaxVertexCount != UVar4) {
              local_50 = (Desc->super_DeviceObjectAttribs).Name;
              if (local_50 == (char *)0x0) {
                local_50 = "";
              }
              local_48 = (Char *)CONCAT44(local_48._4_4_,UVar4);
              LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[19],unsigned_int,char[43],unsigned_int,char[3]>
                        (false,"ValidateBottomLevelASDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                         ,0x53,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                         (char (*) [15])"\' is invalid: ",(char (*) [12])0x6a239a,&local_54,
                         (char (*) [19])"].MaxVertexCount (",&pBVar2[uVar6].MaxVertexCount,
                         (char (*) [43])") must be equal to MaxPrimitiveCount * 3 (",
                         (uint *)&local_48,(char (*) [3])0x75ce90);
            }
          }
          else {
            local_50 = (Desc->super_DeviceObjectAttribs).Name;
            if (local_50 == (char *)0x0) {
              local_50 = "";
            }
            local_48 = GetValueTypeString(pBVar2[uVar6].VertexValueType);
            LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[14],char_const*,char[34]>
                      (false,"ValidateBottomLevelASDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                       ,0x59,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                       (char (*) [15])"\' is invalid: ",(char (*) [12])0x6a239a,&local_54,
                       (char (*) [14])"].IndexType (",&local_48,
                       (char (*) [34])") must be VT_UINT16 or VT_UINT32.");
          }
        }
        local_54 = local_54 + 1;
      } while (local_54 < *local_40);
    }
    local_48 = (Char *)((ulong)local_48 & 0xffffffff00000000);
    if (*local_38 != 0) {
      uVar5 = 0;
      do {
        pBVar3 = Desc->pBoxes;
        if (pBVar3[uVar5].GeometryName == (Char *)0x0) {
          local_50 = (Desc->super_DeviceObjectAttribs).Name;
          if (local_50 == (char *)0x0) {
            local_50 = "";
          }
          LogError<true,char[35],char_const*,char[15],char[8],unsigned_int,char[33]>
                    (false,"ValidateBottomLevelASDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0x62,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                     (char (*) [15])"\' is invalid: ",(char (*) [8])0x7540eb,(uint *)&local_48,
                     (char (*) [33])"].GeometryName must not be null.");
        }
        if (pBVar3[uVar5].MaxBoxCount == 0) {
          local_50 = (Desc->super_DeviceObjectAttribs).Name;
          if (local_50 == (char *)0x0) {
            local_50 = "";
          }
          LogError<true,char[35],char_const*,char[15],char[8],unsigned_int,char[38]>
                    (false,"ValidateBottomLevelASDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0x65,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                     (char (*) [15])"\' is invalid: ",(char (*) [8])0x7540eb,(uint *)&local_48,
                     (char (*) [38])"].MaxBoxCount must be greater than 0.");
        }
        uVar5 = (int)local_48 + 1;
        local_48 = (Char *)CONCAT44(local_48._4_4_,uVar5);
      } while (uVar5 < *local_38);
    }
  }
  else {
    if (Desc->pBoxes != (BLASBoundingBoxDesc *)0x0 || Desc->pTriangles != (BLASTriangleDesc *)0x0) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_50 = "";
      if (pcVar1 != (char *)0x0) {
        local_50 = pcVar1;
      }
      LogError<true,char[35],char_const*,char[15],char[81]>
                (false,"ValidateBottomLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0x28,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [81])
                 "If non-zero CompactedSize is specified, pTriangles and pBoxes must both be null.")
      ;
    }
    if (Desc->Flags != RAYTRACING_BUILD_AS_NONE) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_50 = "";
      if (pcVar1 != (char *)0x0) {
        local_50 = pcVar1;
      }
      LogError<true,char[35],char_const*,char[15],char[80]>
                (false,"ValidateBottomLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0x2b,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [80])
                 "If non-zero CompactedSize is specified, Flags must be RAYTRACING_BUILD_AS_NONE.");
    }
  }
  return;
}

Assistant:

void ValidateBottomLevelASDesc(const BottomLevelASDesc& Desc) noexcept(false)
{
#define LOG_BLAS_ERROR_AND_THROW(...) LOG_ERROR_AND_THROW("Description of a bottom-level AS '", (Desc.Name ? Desc.Name : ""), "' is invalid: ", ##__VA_ARGS__)

    if (Desc.CompactedSize > 0)
    {
        if (Desc.pTriangles != nullptr || Desc.pBoxes != nullptr)
            LOG_BLAS_ERROR_AND_THROW("If non-zero CompactedSize is specified, pTriangles and pBoxes must both be null.");

        if (Desc.Flags != RAYTRACING_BUILD_AS_NONE)
            LOG_BLAS_ERROR_AND_THROW("If non-zero CompactedSize is specified, Flags must be RAYTRACING_BUILD_AS_NONE.");
    }
    else
    {
        if (!((Desc.BoxCount != 0) ^ (Desc.TriangleCount != 0)))
            LOG_BLAS_ERROR_AND_THROW("Exactly one of BoxCount (", Desc.BoxCount, ") and TriangleCount (", Desc.TriangleCount, ") must be non-zero.");

        if (Desc.pBoxes == nullptr && Desc.BoxCount > 0)
            LOG_BLAS_ERROR_AND_THROW("BoxCount is ", Desc.BoxCount, ", but pBoxes is null.");

        if (Desc.pTriangles == nullptr && Desc.TriangleCount > 0)
            LOG_BLAS_ERROR_AND_THROW("TriangleCount is ", Desc.TriangleCount, ", but pTriangles is null.");

        if ((Desc.Flags & RAYTRACING_BUILD_AS_PREFER_FAST_TRACE) != 0 && (Desc.Flags & RAYTRACING_BUILD_AS_PREFER_FAST_BUILD) != 0)
            LOG_BLAS_ERROR_AND_THROW("RAYTRACING_BUILD_AS_PREFER_FAST_TRACE and RAYTRACING_BUILD_AS_PREFER_FAST_BUILD flags are mutually exclusive.");

        for (Uint32 i = 0; i < Desc.TriangleCount; ++i)
        {
            const BLASTriangleDesc& tri = Desc.pTriangles[i];

            if (tri.GeometryName == nullptr)
                LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].GeometryName must not be null.");

            if (tri.VertexValueType != VT_FLOAT32 && tri.VertexValueType != VT_FLOAT16 && tri.VertexValueType != VT_INT16)
                LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].VertexValueType (", GetValueTypeString(tri.VertexValueType),
                                         ") is invalid. Only the following values are allowed: VT_FLOAT32, VT_FLOAT16, VT_INT16.");

            if (tri.VertexComponentCount != 2 && tri.VertexComponentCount != 3)
                LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].VertexComponentCount (", Uint32{tri.VertexComponentCount}, ") is invalid. Only 2 or 3 are allowed.");

            if (tri.MaxVertexCount == 0)
                LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].MaxVertexCount must be greater than 0.");

            if (tri.MaxPrimitiveCount == 0)
                LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].MaxPrimitiveCount must be greater than 0.");

            if (tri.IndexType == VT_UNDEFINED)
            {
                if (tri.MaxVertexCount != tri.MaxPrimitiveCount * 3)
                    LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].MaxVertexCount (", tri.MaxVertexCount,
                                             ") must be equal to MaxPrimitiveCount * 3 (", tri.MaxPrimitiveCount * 3, ").");
            }
            else
            {
                if (tri.IndexType != VT_UINT32 && tri.IndexType != VT_UINT16)
                    LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].IndexType (", GetValueTypeString(tri.VertexValueType),
                                             ") must be VT_UINT16 or VT_UINT32.");
            }
        }

        for (Uint32 i = 0; i < Desc.BoxCount; ++i)
        {
            const BLASBoundingBoxDesc& box = Desc.pBoxes[i];

            if (box.GeometryName == nullptr)
                LOG_BLAS_ERROR_AND_THROW("pBoxes[", i, "].GeometryName must not be null.");

            if (box.MaxBoxCount == 0)
                LOG_BLAS_ERROR_AND_THROW("pBoxes[", i, "].MaxBoxCount must be greater than 0.");
        }
    }

#undef LOG_BLAS_ERROR_AND_THROW
}